

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_stdout_and_stderr_to_file(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  uv_timer_t *puVar8;
  int extraout_EDX;
  char *pcVar9;
  char *pcVar10;
  ulong unaff_RBP;
  uv_process_t *puVar11;
  uv_timer_t *puVar12;
  code *pcVar13;
  uv_process_options_t *unaff_R14;
  undefined8 unaff_R15;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  int iStack_c64;
  undefined1 auStack_c60 [16];
  uv_stdio_container_t uStack_c50;
  undefined4 uStack_c40;
  undefined4 uStack_c38;
  undefined4 uStack_c30;
  undefined4 uStack_c28;
  undefined4 uStack_c20;
  int iStack_c18;
  code *pcStack_c10;
  undefined1 auStack_c08 [240];
  code *pcStack_b18;
  uv_stdio_container_t uStack_b10;
  undefined4 uStack_b00;
  undefined4 uStack_af0;
  undefined4 uStack_ae0;
  undefined1 *puStack_ad8;
  undefined1 auStack_ac8 [264];
  undefined1 *puStack_9c0;
  anon_union_8_2_26168aa3_for_data aStack_9b8;
  code *pcStack_9b0;
  code *pcStack_9a8;
  char acStack_9a0 [32];
  undefined1 *puStack_980;
  undefined8 uStack_978;
  uv_stdio_container_t uStack_970;
  undefined4 uStack_960;
  undefined1 *puStack_958;
  undefined1 auStack_950 [264];
  undefined1 auStack_848 [264];
  undefined1 auStack_740 [192];
  char *pcStack_680;
  uv_process_options_t *puStack_678;
  code *pcStack_670;
  undefined8 uStack_668;
  undefined1 auStack_660 [16];
  uv_process_options_t auStack_650 [6];
  uv_stdio_container_t uStack_498;
  undefined4 uStack_488;
  uint uStack_480;
  undefined4 uStack_478;
  uint uStack_470;
  char *pcStack_460;
  uv_process_options_t *puStack_458;
  undefined1 auStack_430 [16];
  uv_stdio_container_t uStack_420;
  undefined4 uStack_410;
  uint uStack_408;
  undefined4 uStack_400;
  uint uStack_3f8;
  uv_process_options_t auStack_3e8 [6];
  char *pcStack_230;
  uv_process_options_t *puStack_228;
  undefined1 local_208 [16];
  uv_stdio_container_t local_1f8;
  undefined4 local_1e8;
  uint local_1e0;
  undefined4 local_1d8;
  uint local_1d0;
  uv_process_options_t local_1c8 [6];
  
  pcVar9 = "stdout_file";
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open(0,local_1c8,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file_cold_9();
LAB_0016cc3e:
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_0016cc43:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_0016cc48:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_0016cc4d:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_0016cc52:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_0016cc57:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_0016cc5c:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
  }
  else {
    pcVar9 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(local_1c8);
    options.stdio = &local_1f8;
    unaff_R14 = &options;
    local_1f8.flags = UV_IGNORE;
    local_1e8 = 2;
    local_1d8 = 2;
    options.stdio_count = 3;
    local_1e0 = uVar1;
    local_1d0 = uVar1;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0016cc3e;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016cc43;
    if (exit_cb_called != 1) goto LAB_0016cc48;
    if (close_cb_called != 1) goto LAB_0016cc4d;
    local_208 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read(0,local_1c8,pcVar9,local_208,1,0);
    if (iVar2 != 0x1b) goto LAB_0016cc52;
    unaff_R14 = local_1c8;
    uv_fs_req_cleanup(unaff_R14);
    iVar2 = uv_fs_close(0,unaff_R14,uVar1,0);
    if (iVar2 != 0) goto LAB_0016cc57;
    uv_fs_req_cleanup(local_1c8);
    printf("output is: %s",output);
    auVar16[0] = -(output[0xc] == 'h');
    auVar16[1] = -(output[0xd] == 'e');
    auVar16[2] = -(output[0xe] == 'l');
    auVar16[3] = -(output[0xf] == 'l');
    auVar16[4] = -(output[0x10] == 'o');
    auVar16[5] = -(output[0x11] == ' ');
    auVar16[6] = -(output[0x12] == 'e');
    auVar16[7] = -(output[0x13] == 'r');
    auVar16[8] = -(output[0x14] == 'r');
    auVar16[9] = -(output[0x15] == 'w');
    auVar16[10] = -(output[0x16] == 'o');
    auVar16[0xb] = -(output[0x17] == 'r');
    auVar16[0xc] = -(output[0x18] == 'l');
    auVar16[0xd] = -(output[0x19] == 'd');
    auVar16[0xe] = -(output[0x1a] == '\n');
    auVar16[0xf] = -(output[0x1b] == '\0');
    auVar14[0] = -(output[0] == 'h');
    auVar14[1] = -(output[1] == 'e');
    auVar14[2] = -(output[2] == 'l');
    auVar14[3] = -(output[3] == 'l');
    auVar14[4] = -(output[4] == 'o');
    auVar14[5] = -(output[5] == ' ');
    auVar14[6] = -(output[6] == 'w');
    auVar14[7] = -(output[7] == 'o');
    auVar14[8] = -(output[8] == 'r');
    auVar14[9] = -(output[9] == 'l');
    auVar14[10] = -(output[10] == 'd');
    auVar14[0xb] = -(output[0xb] == '\n');
    auVar14[0xc] = -(output[0xc] == 'h');
    auVar14[0xd] = -(output[0xd] == 'e');
    auVar14[0xe] = -(output[0xe] == 'l');
    auVar14[0xf] = -(output[0xf] == 'l');
    auVar14 = auVar14 & auVar16;
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016cc5c;
    unlink("stdout_file");
    pcVar9 = (char *)uv_default_loop();
    uv_walk(pcVar9,close_walk_cb,0);
    uv_run(pcVar9,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_8();
  pcVar10 = "stdout_file";
  pcStack_230 = pcVar9;
  puStack_228 = unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open(0,auStack_3e8,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_0016ce69:
    run_test_spawn_stdout_and_stderr_to_file2_cold_9();
LAB_0016ce6e:
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_0016ce73:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_0016ce78:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_0016ce7d:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_0016ce82:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_0016ce87:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_0016ce8c:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
  }
  else {
    pcVar10 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(auStack_3e8);
    unaff_RBP = 2;
    uVar1 = dup2(uVar1,2);
    if (uVar1 == 0xffffffff) goto LAB_0016ce69;
    pcVar10 = (char *)(ulong)uVar1;
    options.stdio = &uStack_420;
    unaff_R14 = &options;
    uStack_420.flags = UV_IGNORE;
    uStack_410 = 2;
    uStack_400 = 2;
    options.stdio_count = 3;
    uStack_408 = uVar1;
    uStack_3f8 = uVar1;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0016ce6e;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016ce73;
    if (exit_cb_called != 1) goto LAB_0016ce78;
    if (close_cb_called != 1) goto LAB_0016ce7d;
    auStack_430 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read(0,auStack_3e8,pcVar10,auStack_430,1,0);
    if (iVar2 != 0x1b) goto LAB_0016ce82;
    unaff_R14 = auStack_3e8;
    uv_fs_req_cleanup(unaff_R14);
    iVar2 = uv_fs_close(0,unaff_R14,uVar1,0);
    if (iVar2 != 0) goto LAB_0016ce87;
    uv_fs_req_cleanup(auStack_3e8);
    printf("output is: %s",output);
    auVar17[0] = -(output[0xc] == 'h');
    auVar17[1] = -(output[0xd] == 'e');
    auVar17[2] = -(output[0xe] == 'l');
    auVar17[3] = -(output[0xf] == 'l');
    auVar17[4] = -(output[0x10] == 'o');
    auVar17[5] = -(output[0x11] == ' ');
    auVar17[6] = -(output[0x12] == 'e');
    auVar17[7] = -(output[0x13] == 'r');
    auVar17[8] = -(output[0x14] == 'r');
    auVar17[9] = -(output[0x15] == 'w');
    auVar17[10] = -(output[0x16] == 'o');
    auVar17[0xb] = -(output[0x17] == 'r');
    auVar17[0xc] = -(output[0x18] == 'l');
    auVar17[0xd] = -(output[0x19] == 'd');
    auVar17[0xe] = -(output[0x1a] == '\n');
    auVar17[0xf] = -(output[0x1b] == '\0');
    auVar15[0] = -(output[0] == 'h');
    auVar15[1] = -(output[1] == 'e');
    auVar15[2] = -(output[2] == 'l');
    auVar15[3] = -(output[3] == 'l');
    auVar15[4] = -(output[4] == 'o');
    auVar15[5] = -(output[5] == ' ');
    auVar15[6] = -(output[6] == 'w');
    auVar15[7] = -(output[7] == 'o');
    auVar15[8] = -(output[8] == 'r');
    auVar15[9] = -(output[9] == 'l');
    auVar15[10] = -(output[10] == 'd');
    auVar15[0xb] = -(output[0xb] == '\n');
    auVar15[0xc] = -(output[0xc] == 'h');
    auVar15[0xd] = -(output[0xd] == 'e');
    auVar15[0xe] = -(output[0xe] == 'l');
    auVar15[0xf] = -(output[0xf] == 'l');
    auVar15 = auVar15 & auVar17;
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016ce8c;
    unlink("stdout_file");
    pcVar10 = (char *)uv_default_loop();
    uv_walk(pcVar10,close_walk_cb,0);
    uv_run(pcVar10,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  pcVar9 = "stdout_file";
  pcStack_670 = (code *)0x16ceb2;
  pcStack_460 = pcVar10;
  puStack_458 = unaff_R14;
  unlink("stdout_file");
  pcStack_670 = (code *)0x16cebe;
  unlink("stderr_file");
  pcStack_670 = (code *)0x16ced1;
  init_process_options("spawn_helper6",exit_cb);
  pcStack_670 = (code *)0x16ceee;
  uVar1 = uv_fs_open(0,auStack_650,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    pcStack_670 = (code *)0x16d19a;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_0016d19a:
    pcStack_670 = (code *)0x16d19f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_0016d19f:
    pcStack_670 = (code *)0x16d1a4;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_0016d1a4:
    pcStack_670 = (code *)0x16d1a9;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_0016d1a9:
    pcStack_670 = (code *)0x16d1ae;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_0016d1ae:
    pcStack_670 = (code *)0x16d1b3;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_0016d1b3:
    pcStack_670 = (code *)0x16d1b8;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_0016d1b8:
    pcStack_670 = (code *)0x16d1bd;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_0016d1bd:
    pcStack_670 = (code *)0x16d1c2;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_0016d1c2:
    pcStack_670 = (code *)0x16d1c7;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
LAB_0016d1c7:
    pcStack_670 = (code *)0x16d1cc;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_0016d1cc:
    pcStack_670 = (code *)0x16d1d1;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_0016d1d1:
    pcStack_670 = (code *)0x16d1d6;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_0016d1d6:
    pcStack_670 = (code *)0x16d1db;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  else {
    pcVar9 = (char *)(ulong)uVar1;
    pcStack_670 = (code *)0x16cf03;
    uv_fs_req_cleanup(auStack_650);
    pcStack_670 = (code *)0x16cf0f;
    uVar1 = dup2(uVar1,1);
    if (uVar1 == 0xffffffff) goto LAB_0016d19a;
    unaff_RBP = (ulong)uVar1;
    pcStack_670 = (code *)0x16cf3b;
    uVar3 = uv_fs_open(0,auStack_650,"stderr_file",0x42,0x180,0);
    if (uVar3 == 0xffffffff) goto LAB_0016d19f;
    pcVar9 = (char *)(ulong)uVar3;
    pcStack_670 = (code *)0x16cf50;
    uv_fs_req_cleanup(auStack_650);
    unaff_R15 = 2;
    pcStack_670 = (code *)0x16cf62;
    uVar3 = dup2(uVar3,2);
    if (uVar3 == 0xffffffff) goto LAB_0016d1a4;
    pcVar9 = (char *)(ulong)uVar3;
    options.stdio = &uStack_498;
    unaff_R14 = &options;
    uStack_498.flags = UV_IGNORE;
    uStack_488 = 2;
    uStack_478 = 2;
    options.stdio_count = 3;
    pcStack_670 = (code *)0x16cfa6;
    uStack_480 = uVar3;
    uStack_470 = uVar1;
    uVar5 = uv_default_loop();
    pcStack_670 = (code *)0x16cfb8;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0016d1a9;
    pcStack_670 = (code *)0x16cfc5;
    uVar5 = uv_default_loop();
    pcStack_670 = (code *)0x16cfcf;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016d1ae;
    if (exit_cb_called != 1) goto LAB_0016d1b3;
    if (close_cb_called != 1) goto LAB_0016d1b8;
    pcStack_670 = (code *)0x16d002;
    auStack_660 = uv_buf_init(output,0x400);
    uStack_668 = 0;
    pcStack_670 = (code *)0x16d02d;
    iVar2 = uv_fs_read(0,auStack_650,uVar1,auStack_660,1,0);
    if (iVar2 < 0xf) goto LAB_0016d1bd;
    unaff_R14 = auStack_650;
    pcStack_670 = (code *)0x16d043;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_670 = (code *)0x16d051;
    iVar2 = uv_fs_close(0,unaff_R14,unaff_RBP,0);
    if (iVar2 != 0) goto LAB_0016d1c2;
    pcStack_670 = (code *)0x16d063;
    uv_fs_req_cleanup(auStack_650);
    pcStack_670 = (code *)0x16d078;
    printf("output is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa646c726f777272 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7265206f6c6c6568) goto LAB_0016d1c7;
    uStack_668 = 0;
    pcStack_670 = (code *)0x16d0c7;
    iVar2 = uv_fs_read(0,auStack_650,uVar3,auStack_660,1,0);
    if (iVar2 < 0xc) goto LAB_0016d1cc;
    unaff_R14 = auStack_650;
    pcStack_670 = (code *)0x16d0dd;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_670 = (code *)0x16d0eb;
    iVar2 = uv_fs_close(0,unaff_R14,pcVar9,0);
    if (iVar2 != 0) goto LAB_0016d1d1;
    pcStack_670 = (code *)0x16d0fd;
    uv_fs_req_cleanup(auStack_650);
    pcStack_670 = (code *)0x16d112;
    printf("output is: %s",output);
    if (CONCAT13(output[0xb],CONCAT12(output[10],CONCAT11(output[9],output[8]))) != 0xa646c72 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x6f77206f6c6c6568) goto LAB_0016d1d6;
    pcStack_670 = (code *)0x16d145;
    unlink("stdout_file");
    pcStack_670 = (code *)0x16d151;
    unlink("stderr_file");
    pcStack_670 = (code *)0x16d156;
    pcVar9 = (char *)uv_default_loop();
    pcStack_670 = (code *)0x16d16a;
    uv_walk(pcVar9,close_walk_cb,0);
    pcStack_670 = (code *)0x16d174;
    uv_run(pcVar9,0);
    pcStack_670 = (code *)0x16d179;
    uVar5 = uv_default_loop();
    pcStack_670 = (code *)0x16d181;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStack_670 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  pcVar10 = acStack_9a0;
  builtin_strncpy(acStack_9a0,"hello-from-spawn_stdin",0x17);
  pcStack_9a8 = (code *)0x16d219;
  pcStack_680 = pcVar9;
  puStack_678 = unaff_R14;
  pcStack_670 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStack_9a8 = (code *)0x16d21e;
  uVar5 = uv_default_loop();
  puVar7 = auStack_848;
  pcStack_9a8 = (code *)0x16d233;
  uv_pipe_init(uVar5,puVar7,0);
  pcStack_9a8 = (code *)0x16d238;
  uVar5 = uv_default_loop();
  pcStack_9a8 = (code *)0x16d24a;
  uv_pipe_init(uVar5,(uv_stream_t *)auStack_950,0);
  options.stdio = &uStack_970;
  uStack_970.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStack_960 = 0x21;
  options.stdio_count = 2;
  pcStack_9a8 = (code *)0x16d281;
  uStack_970.data.stream = (uv_stream_t *)auStack_950;
  puStack_958 = puVar7;
  puVar6 = (undefined1 *)uv_default_loop();
  iVar2 = 0x31aa10;
  pcStack_9a8 = (code *)0x16d293;
  iVar4 = uv_spawn(puVar6,&process,&options);
  if (iVar4 == 0) {
    uStack_978 = 0x17;
    puVar6 = auStack_740;
    iVar2 = (int)auStack_950;
    pcStack_9a8 = (code *)0x16d2cc;
    puStack_980 = acStack_9a0;
    iVar4 = uv_write();
    if (iVar4 != 0) goto LAB_0016d377;
    iVar2 = 0x16c809;
    puVar6 = auStack_848;
    pcStack_9a8 = (code *)0x16d2ef;
    iVar4 = uv_read_start(puVar6,on_alloc,on_read);
    if (iVar4 != 0) goto LAB_0016d37c;
    pcStack_9a8 = (code *)0x16d2fc;
    puVar6 = (undefined1 *)uv_default_loop();
    iVar2 = 0;
    pcStack_9a8 = (code *)0x16d306;
    iVar4 = uv_run();
    if (iVar4 != 0) goto LAB_0016d381;
    if (exit_cb_called != 1) goto LAB_0016d386;
    if (close_cb_called != 3) goto LAB_0016d38b;
    iVar2 = 0x31aaa0;
    pcStack_9a8 = (code *)0x16d32b;
    iVar4 = strcmp(acStack_9a0,output);
    if (iVar4 != 0) goto LAB_0016d390;
    pcStack_9a8 = (code *)0x16d334;
    puVar7 = (undefined1 *)uv_default_loop();
    pcStack_9a8 = (code *)0x16d348;
    uv_walk(puVar7,close_walk_cb,0);
    iVar2 = 0;
    pcStack_9a8 = (code *)0x16d352;
    uv_run(puVar7);
    pcStack_9a8 = (code *)0x16d357;
    pcVar10 = (char *)uv_default_loop();
    pcStack_9a8 = (code *)0x16d35f;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    pcStack_9a8 = (code *)0x16d377;
    run_test_spawn_stdin_cold_1();
LAB_0016d377:
    pcStack_9a8 = (code *)0x16d37c;
    run_test_spawn_stdin_cold_2();
LAB_0016d37c:
    pcStack_9a8 = (code *)0x16d381;
    run_test_spawn_stdin_cold_3();
LAB_0016d381:
    pcStack_9a8 = (code *)0x16d386;
    run_test_spawn_stdin_cold_4();
LAB_0016d386:
    pcStack_9a8 = (code *)0x16d38b;
    run_test_spawn_stdin_cold_5();
LAB_0016d38b:
    pcVar10 = puVar6;
    pcStack_9a8 = (code *)0x16d390;
    run_test_spawn_stdin_cold_6();
LAB_0016d390:
    pcStack_9a8 = (code *)0x16d395;
    run_test_spawn_stdin_cold_7();
  }
  pcStack_9a8 = write_cb;
  run_test_spawn_stdin_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_close(*(undefined8 *)(pcVar10 + 0x50),close_cb);
    return iVar2;
  }
  pcStack_9b0 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  pcStack_b18 = (code *)0x16d3d2;
  puStack_9c0 = puVar7;
  aStack_9b8.stream = (uv_stream_t *)auStack_950;
  pcStack_9b0 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  pcStack_b18 = (code *)0x16d3d7;
  uVar5 = uv_default_loop();
  puVar7 = auStack_ac8;
  pcStack_b18 = (code *)0x16d3eb;
  uv_pipe_init(uVar5,puVar7,0);
  uStack_b10.flags = UV_IGNORE;
  uStack_b00 = 0;
  uStack_af0 = 0;
  uStack_ae0 = 0x21;
  options.stdio_count = 4;
  pcStack_b18 = (code *)0x16d41e;
  options.stdio = &uStack_b10;
  puStack_ad8 = puVar7;
  uVar5 = uv_default_loop();
  pcStack_b18 = (code *)0x16d430;
  iVar2 = uv_spawn(uVar5,&process,&options);
  if (iVar2 == 0) {
    pcStack_b18 = (code *)0x16d450;
    iVar2 = uv_read_start(auStack_ac8,on_alloc,on_read);
    if (iVar2 != 0) goto LAB_0016d50c;
    pcStack_b18 = (code *)0x16d45d;
    uVar5 = uv_default_loop();
    pcStack_b18 = (code *)0x16d467;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016d511;
    if (exit_cb_called != 1) goto LAB_0016d516;
    if (close_cb_called != 2) goto LAB_0016d51b;
    pcStack_b18 = (code *)0x16d49e;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa216f69647473 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7320687472756f66) goto LAB_0016d520;
    pcStack_b18 = (code *)0x16d4ca;
    puVar7 = (undefined1 *)uv_default_loop();
    pcStack_b18 = (code *)0x16d4de;
    uv_walk(puVar7,close_walk_cb,0);
    pcStack_b18 = (code *)0x16d4e8;
    uv_run(puVar7,0);
    pcStack_b18 = (code *)0x16d4ed;
    uVar5 = uv_default_loop();
    pcStack_b18 = (code *)0x16d4f5;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_b18 = (code *)0x16d50c;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_0016d50c:
    pcStack_b18 = (code *)0x16d511;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_0016d511:
    pcStack_b18 = (code *)0x16d516;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_0016d516:
    pcStack_b18 = (code *)0x16d51b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_0016d51b:
    pcStack_b18 = (code *)0x16d520;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_0016d520:
    pcStack_b18 = (code *)0x16d525;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  pcStack_b18 = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  pcStack_c10 = (code *)0x16d536;
  uVar5 = uv_default_loop();
  pcStack_c10 = (code *)0x16d541;
  iVar2 = uv_tcp_init(uVar5,auStack_c08);
  if (iVar2 == 0) {
    pcStack_c10 = (code *)0x16d552;
    iVar2 = uv_tcp_open(auStack_c08,3);
    if (iVar2 != 0) goto LAB_0016d57b;
    pcStack_c10 = (code *)0x16d565;
    iVar2 = uv_listen(auStack_c08,0x1000,0);
    if (iVar2 == 0) {
      return 1;
    }
  }
  else {
    pcStack_c10 = (code *)0x16d57b;
    spawn_tcp_server_helper_cold_1();
LAB_0016d57b:
    pcStack_c10 = (code *)0x16d580;
    spawn_tcp_server_helper_cold_2();
  }
  pcStack_c10 = run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  pcStack_c10 = (code *)puVar7;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_c60);
  if (iVar2 == 0) {
    iStack_c64 = -1;
    uVar5 = uv_default_loop();
    iVar2 = uv_tcp_init_ex(uVar5,&tcp_server,2);
    if (iVar2 != 0) goto LAB_0016d6e6;
    iVar2 = uv_tcp_bind(&tcp_server,auStack_c60,0);
    if (iVar2 != 0) goto LAB_0016d6eb;
    iVar2 = uv_fileno(&tcp_server,&iStack_c64);
    if (iVar2 != 0) goto LAB_0016d6f0;
    if (iStack_c64 < 1) goto LAB_0016d6f5;
    options.stdio = &uStack_c50;
    uStack_c50.flags = UV_INHERIT_FD;
    uStack_c50.data.fd = 0;
    uStack_c40 = 2;
    uStack_c38 = 1;
    uStack_c30 = 2;
    uStack_c28 = 2;
    uStack_c20 = 2;
    iStack_c18 = iStack_c64;
    options.stdio_count = 4;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0016d6fa;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016d6ff;
    if (exit_cb_called != 1) goto LAB_0016d704;
    if (close_cb_called != 1) goto LAB_0016d709;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_0016d6e6:
    run_test_spawn_tcp_server_cold_2();
LAB_0016d6eb:
    run_test_spawn_tcp_server_cold_3();
LAB_0016d6f0:
    run_test_spawn_tcp_server_cold_4();
LAB_0016d6f5:
    run_test_spawn_tcp_server_cold_5();
LAB_0016d6fa:
    run_test_spawn_tcp_server_cold_6();
LAB_0016d6ff:
    run_test_spawn_tcp_server_cold_7();
LAB_0016d704:
    run_test_spawn_tcp_server_cold_8();
LAB_0016d709:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  uVar5 = uv_default_loop();
  iVar2 = uv_spawn(uVar5,&process,&options);
  if (iVar2 == 0) {
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016d7c0;
    if (exit_cb_called != 1) goto LAB_0016d7c5;
    if (close_cb_called != 1) goto LAB_0016d7ca;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0016d7c0:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0016d7c5:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0016d7ca:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  puVar8 = (uv_timer_t *)uv_default_loop();
  puVar11 = &process;
  iVar2 = uv_spawn(puVar8,&process,&options);
  if (iVar2 == 0) {
    puVar8 = (uv_timer_t *)uv_default_loop();
    puVar12 = &timer;
    iVar2 = uv_timer_init();
    pcVar13 = (code *)puVar12;
    if (iVar2 != 0) goto LAB_0016d8a7;
    puVar8 = &timer;
    pcVar13 = timer_cb;
    iVar2 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar2 != 0) goto LAB_0016d8ac;
    puVar8 = (uv_timer_t *)uv_default_loop();
    pcVar13 = (code *)0x0;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_0016d8b1;
    if (exit_cb_called != 1) goto LAB_0016d8b6;
    if (close_cb_called != 2) goto LAB_0016d8bb;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    pcVar13 = (code *)0x0;
    uv_run(uVar5);
    puVar8 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar13 = (code *)puVar11;
LAB_0016d8a7:
    run_test_spawn_and_kill_cold_2();
LAB_0016d8ac:
    run_test_spawn_and_kill_cold_3();
LAB_0016d8b1:
    run_test_spawn_and_kill_cold_4();
LAB_0016d8b6:
    run_test_spawn_and_kill_cold_5();
LAB_0016d8bb:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar9 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar13 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close(puVar8,close_cb);
      pcVar9 = (char *)(ulong)*(uint *)puVar8->heap_node;
      iVar2 = uv_kill(pcVar9,0);
      if (iVar2 == -3) {
        return iVar2;
      }
      goto LAB_0016d91a;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0016d91a:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar2 = uv_close(pcVar9,close_cb);
  return iVar2;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file) {
  int r;
  uv_file file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper6", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);

  file = r;

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT(r == 27);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strcmp("hello world\nhello errworld\n", output) == 0);

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}